

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

ON_wString __thiscall
ON_TextureMapping::TypeToString(ON_TextureMapping *this,TYPE texture_mapping_type)

{
  char *s;
  
  switch(texture_mapping_type) {
  case no_mapping:
    s = "ON_TextureMapping::TYPE::no_mapping";
    break;
  case srfp_mapping:
    s = "ON_TextureMapping::TYPE::srfp_mapping";
    break;
  case plane_mapping:
    s = "ON_TextureMapping::TYPE::plane_mapping";
    break;
  case cylinder_mapping:
    s = "ON_TextureMapping::TYPE::cylinder_mapping";
    break;
  case sphere_mapping:
    s = "ON_TextureMapping::TYPE::sphere_mapping";
    break;
  case box_mapping:
    s = "ON_TextureMapping::TYPE::box_mapping";
    break;
  case mesh_mapping_primitive:
    s = "ON_TextureMapping::TYPE::mesh_mapping_primitive";
    break;
  case srf_mapping_primitive:
    s = "ON_TextureMapping::TYPE::srf_mapping_primitive";
    break;
  case brep_mapping_primitive:
    s = "ON_TextureMapping::TYPE::brep_mapping_primitive";
    break;
  case ocs_mapping:
    s = "ON_TextureMapping::TYPE::ocs_mapping";
    break;
  case false_colors:
    s = "ON_TextureMapping::TYPE::false_colors";
    break;
  case wcs_projection:
    s = "ON_TextureMapping::TYPE::wcs_projection";
    break;
  case wcsbox_projection:
    s = "ON_TextureMapping::TYPE::wcsbox_projection";
    break;
  default:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_material.cpp"
               ,0xa94,"","Invalid texture_mapping_type value.");
    ON_wString::ON_wString((ON_wString *)this,&ON_wString::EmptyString);
    return (ON_wString)(wchar_t *)this;
  }
  ON_wString::ON_wString((ON_wString *)this,s);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_TextureMapping::TypeToString(ON_TextureMapping::TYPE texture_mapping_type)
{
  switch (texture_mapping_type)
  {
  ON_ENUM_TO_WIDE_STRING_CASE(ON_TextureMapping::TYPE::no_mapping);
  ON_ENUM_TO_WIDE_STRING_CASE(ON_TextureMapping::TYPE::srfp_mapping);
  ON_ENUM_TO_WIDE_STRING_CASE(ON_TextureMapping::TYPE::plane_mapping);
  ON_ENUM_TO_WIDE_STRING_CASE(ON_TextureMapping::TYPE::cylinder_mapping);
  ON_ENUM_TO_WIDE_STRING_CASE(ON_TextureMapping::TYPE::sphere_mapping);
  ON_ENUM_TO_WIDE_STRING_CASE(ON_TextureMapping::TYPE::box_mapping);
  ON_ENUM_TO_WIDE_STRING_CASE(ON_TextureMapping::TYPE::mesh_mapping_primitive);
  ON_ENUM_TO_WIDE_STRING_CASE(ON_TextureMapping::TYPE::srf_mapping_primitive);
  ON_ENUM_TO_WIDE_STRING_CASE(ON_TextureMapping::TYPE::brep_mapping_primitive);
  ON_ENUM_TO_WIDE_STRING_CASE(ON_TextureMapping::TYPE::ocs_mapping);
  ON_ENUM_TO_WIDE_STRING_CASE(ON_TextureMapping::TYPE::false_colors);
  ON_ENUM_TO_WIDE_STRING_CASE(ON_TextureMapping::TYPE::wcs_projection);
  ON_ENUM_TO_WIDE_STRING_CASE(ON_TextureMapping::TYPE::wcsbox_projection);
  }

  ON_ERROR("Invalid texture_mapping_type value.");
  return ON_wString::EmptyString;
}